

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O2

XrResult GenValidUsageInputsXrGetQueriedSenseDataBD
                   (XrSenseDataSnapshotBD snapshot,XrQueriedSenseDataGetInfoBD *getInfo,
                   XrQueriedSenseDataBD *queriedSenseData)

{
  ValidateXrHandleResult VVar1;
  XrResult XVar2;
  XrResult XVar3;
  GenValidUsageXrInstanceInfo *instance_info;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *this;
  pair<GenValidUsageXrHandleInfo_*,_GenValidUsageXrInstanceInfo_*> pVar4;
  XrSenseDataSnapshotBD_T *in_stack_fffffffffffffd68;
  string local_290;
  string local_270;
  XrSenseDataSnapshotBD snapshot_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> objects_info;
  string local_230;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_210;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1f8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1e0;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1c8;
  _Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_1b0;
  ostringstream oss;
  
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  objects_info.
  super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  _oss = 0x3ba0b989;
  snapshot_local = snapshot;
  std::vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>>::
  emplace_back<XrSenseDataSnapshotBD_T*&,XrObjectType>
            ((vector<GenValidUsageXrObjectInfo,std::allocator<GenValidUsageXrObjectInfo>> *)
             &objects_info,&snapshot_local,(XrObjectType *)&oss);
  VVar1 = VerifyXrSenseDataSnapshotBDHandle(&snapshot_local);
  if (VVar1 == VALIDATE_XR_HANDLE_SUCCESS) {
    pVar4 = HandleInfo<XrSenseDataSnapshotBD_T_*>::getWithInstanceInfo
                      (&g_sensedatasnapshotbd_info,snapshot_local);
    instance_info = pVar4.second;
    if (getInfo == (XrQueriedSenseDataGetInfoBD *)0x0) {
      std::__cxx11::string::string
                ((string *)&oss,"VUID-xrGetQueriedSenseDataBD-getInfo-parameter",
                 (allocator *)&local_230);
      std::__cxx11::string::string
                ((string *)&local_290,"xrGetQueriedSenseDataBD",
                 (allocator *)&stack0xfffffffffffffd6f);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                 &local_1c8,&objects_info);
      std::__cxx11::string::string
                ((string *)&local_270,
                 "Invalid NULL for XrQueriedSenseDataGetInfoBD \"getInfo\" which is not optional and must be non-NULL"
                 ,(allocator *)&stack0xfffffffffffffd6e);
      CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290,
                          (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                           *)&local_1c8,&local_270);
      std::__cxx11::string::~string((string *)&local_270);
      this = &local_1c8;
    }
    else {
      std::__cxx11::string::string((string *)&oss,"xrGetQueriedSenseDataBD",(allocator *)&local_290)
      ;
      XVar2 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,getInfo);
      std::__cxx11::string::~string((string *)&oss);
      if (XVar2 == XR_SUCCESS) {
        if (queriedSenseData == (XrQueriedSenseDataBD *)0x0) {
          std::__cxx11::string::string
                    ((string *)&oss,"VUID-xrGetQueriedSenseDataBD-queriedSenseData-parameter",
                     (allocator *)&local_230);
          std::__cxx11::string::string
                    ((string *)&local_290,"xrGetQueriedSenseDataBD",
                     (allocator *)&stack0xfffffffffffffd6f);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_1f8,&objects_info);
          std::__cxx11::string::string
                    ((string *)&local_270,
                     "Invalid NULL for XrQueriedSenseDataBD \"queriedSenseData\" which is not optional and must be non-NULL"
                     ,(allocator *)&stack0xfffffffffffffd6e);
          CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              &local_290,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_1f8,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          this = &local_1f8;
        }
        else {
          std::__cxx11::string::string
                    ((string *)&oss,"xrGetQueriedSenseDataBD",(allocator *)&local_290);
          XVar2 = XR_SUCCESS;
          XVar3 = ValidateXrStruct(instance_info,(string *)&oss,&objects_info,false,true,
                                   queriedSenseData);
          std::__cxx11::string::~string((string *)&oss);
          if (XVar3 == XR_SUCCESS) goto LAB_00210144;
          std::__cxx11::string::string
                    ((string *)&oss,"VUID-xrGetQueriedSenseDataBD-queriedSenseData-parameter",
                     (allocator *)&local_230);
          std::__cxx11::string::string
                    ((string *)&local_290,"xrGetQueriedSenseDataBD",
                     (allocator *)&stack0xfffffffffffffd6f);
          std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                    ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                      *)&local_210,&objects_info);
          std::__cxx11::string::string
                    ((string *)&local_270,
                     "Command xrGetQueriedSenseDataBD param queriedSenseData is invalid",
                     (allocator *)&stack0xfffffffffffffd6e);
          CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,
                              &local_290,
                              (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                               *)&local_210,&local_270);
          std::__cxx11::string::~string((string *)&local_270);
          this = &local_210;
        }
      }
      else {
        std::__cxx11::string::string
                  ((string *)&oss,"VUID-xrGetQueriedSenseDataBD-getInfo-parameter",
                   (allocator *)&local_230);
        std::__cxx11::string::string
                  ((string *)&local_290,"xrGetQueriedSenseDataBD",
                   (allocator *)&stack0xfffffffffffffd6f);
        std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                  ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
                   &local_1e0,&objects_info);
        std::__cxx11::string::string
                  ((string *)&local_270,"Command xrGetQueriedSenseDataBD param getInfo is invalid",
                   (allocator *)&stack0xfffffffffffffd6e);
        CoreValidLogMessage(instance_info,(string *)&oss,VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_290
                            ,(vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                              *)&local_1e0,&local_270);
        std::__cxx11::string::~string((string *)&local_270);
        this = &local_1e0;
      }
    }
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(this);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::~string((string *)&oss);
    XVar2 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
    std::operator<<((ostream *)&oss,"Invalid XrSenseDataSnapshotBD handle \"snapshot\" ");
    HandleToHexString<XrSenseDataSnapshotBD_T*>(in_stack_fffffffffffffd68);
    std::operator<<((ostream *)&oss,(string *)&local_290);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::string::string
              ((string *)&local_290,"VUID-xrGetQueriedSenseDataBD-snapshot-parameter",
               (allocator *)&stack0xfffffffffffffd6f);
    std::__cxx11::string::string
              ((string *)&local_270,"xrGetQueriedSenseDataBD",(allocator *)&stack0xfffffffffffffd6e)
    ;
    std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
              ((vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
               &local_1b0,&objects_info);
    std::__cxx11::stringbuf::str();
    CoreValidLogMessage((GenValidUsageXrInstanceInfo *)0x0,&local_290,
                        VALID_USAGE_DEBUG_SEVERITY_ERROR,&local_270,
                        (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *)&local_1b0,&local_230);
    std::__cxx11::string::~string((string *)&local_230);
    std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
    ~_Vector_base(&local_1b0);
    std::__cxx11::string::~string((string *)&local_270);
    std::__cxx11::string::~string((string *)&local_290);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss);
    XVar2 = XR_ERROR_HANDLE_INVALID;
  }
LAB_00210144:
  std::_Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::
  ~_Vector_base(&objects_info.
                 super__Vector_base<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
               );
  return XVar2;
}

Assistant:

XrResult GenValidUsageInputsXrGetQueriedSenseDataBD(
XrSenseDataSnapshotBD snapshot,
XrQueriedSenseDataGetInfoBD* getInfo,
XrQueriedSenseDataBD* queriedSenseData) {
    try {
        XrResult xr_result = XR_SUCCESS;
        std::vector<GenValidUsageXrObjectInfo> objects_info;
        objects_info.emplace_back(snapshot, XR_OBJECT_TYPE_SENSE_DATA_SNAPSHOT_BD);

        {
            // writeValidateInlineHandleValidation
            ValidateXrHandleResult handle_result = VerifyXrSenseDataSnapshotBDHandle(&snapshot);
            if (handle_result != VALIDATE_XR_HANDLE_SUCCESS) {
                // Not a valid handle or NULL (which is not valid in this case)
                std::ostringstream oss;
                oss << "Invalid XrSenseDataSnapshotBD handle \"snapshot\" ";
                oss << HandleToHexString(snapshot);
                CoreValidLogMessage(nullptr, "VUID-xrGetQueriedSenseDataBD-snapshot-parameter",
                                    VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetQueriedSenseDataBD",
                                    objects_info, oss.str());
                return XR_ERROR_HANDLE_INVALID;
            }
        }
        auto info_with_instance = g_sensedatasnapshotbd_info.getWithInstanceInfo(snapshot);
        GenValidUsageXrHandleInfo *gen_sensedatasnapshotbd_info = info_with_instance.first;
        (void)gen_sensedatasnapshotbd_info;  // quiet warnings
        GenValidUsageXrInstanceInfo *gen_instance_info = info_with_instance.second;
        (void)gen_instance_info;  // quiet warnings
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == getInfo) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetQueriedSenseDataBD-getInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetQueriedSenseDataBD", objects_info,
                                "Invalid NULL for XrQueriedSenseDataGetInfoBD \"getInfo\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrQueriedSenseDataGetInfoBD is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetQueriedSenseDataBD", objects_info,
                                                        false, true, getInfo);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetQueriedSenseDataBD-getInfo-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetQueriedSenseDataBD",
                                objects_info,
                                "Command xrGetQueriedSenseDataBD param getInfo is invalid");
            return xr_result;
        }
        // Non-optional pointer/array variable that needs to not be NULL
        if (nullptr == queriedSenseData) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetQueriedSenseDataBD-queriedSenseData-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetQueriedSenseDataBD", objects_info,
                                "Invalid NULL for XrQueriedSenseDataBD \"queriedSenseData\" which is not "
                                "optional and must be non-NULL");
            return XR_ERROR_VALIDATION_FAILURE;
        }
        // Validate that the structure XrQueriedSenseDataBD is valid
        xr_result = ValidateXrStruct(gen_instance_info, "xrGetQueriedSenseDataBD", objects_info,
                                                        false, true, queriedSenseData);
        if (XR_SUCCESS != xr_result) {
            CoreValidLogMessage(gen_instance_info, "VUID-xrGetQueriedSenseDataBD-queriedSenseData-parameter",
                                VALID_USAGE_DEBUG_SEVERITY_ERROR, "xrGetQueriedSenseDataBD",
                                objects_info,
                                "Command xrGetQueriedSenseDataBD param queriedSenseData is invalid");
            return xr_result;
        }
        return xr_result;
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
}